

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void double_jacobian_secp256k1(uECC_word_t *X1,uECC_word_t *Y1,uECC_word_t *Z1,uECC_Curve curve)

{
  uECC_word_t *mod;
  ulong uVar1;
  undefined4 in_EAX;
  int iVar2;
  uECC_word_t *puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uECC_word_t *end;
  ulong uVar7;
  undefined1 auVar8 [16];
  uECC_word_t product [8];
  uECC_word_t t5 [4];
  uECC_word_t t4 [4];
  uECC_word_t auStack_b8 [8];
  uECC_word_t local_78 [4];
  uECC_word_t local_58 [5];
  
  auVar8._0_4_ = -(uint)((int)Z1[2] == 0 && (int)*Z1 == 0);
  auVar8._4_4_ = -(uint)(*(int *)((long)Z1 + 0x14) == 0 && *(int *)((long)Z1 + 4) == 0);
  auVar8._8_4_ = -(uint)((int)Z1[3] == 0 && (int)Z1[1] == 0);
  auVar8._12_4_ = -(uint)(*(int *)((long)Z1 + 0x1c) == 0 && *(int *)((long)Z1 + 0xc) == 0);
  iVar2 = movmskps(in_EAX,auVar8);
  if (iVar2 != 0xf) {
    uECC_vli_mult(auStack_b8,Y1,Y1,curve->num_words);
    (*curve->mmod_fast)(local_78,auStack_b8);
    uECC_vli_mult(auStack_b8,X1,local_78,curve->num_words);
    (*curve->mmod_fast)(local_58,auStack_b8);
    uECC_vli_mult(auStack_b8,X1,X1,curve->num_words);
    (*curve->mmod_fast)(X1,auStack_b8);
    uECC_vli_mult(auStack_b8,local_78,local_78,curve->num_words);
    (*curve->mmod_fast)(local_78,auStack_b8);
    uECC_vli_mult(auStack_b8,Y1,Z1,curve->num_words);
    (*curve->mmod_fast)(Z1,auStack_b8);
    mod = curve->p;
    uECC_vli_modAdd(Y1,X1,X1,mod,'\x04');
    uECC_vli_modAdd(Y1,Y1,X1,mod,'\x04');
    if ((*Y1 & 1) == 0) {
      puVar3 = Y1 + 4;
      uVar6 = 0;
      do {
        uVar1 = puVar3[-1];
        puVar3[-1] = uVar1 >> 1 | uVar6;
        puVar3 = puVar3 + -1;
        uVar6 = uVar1 << 0x3f;
      } while (Y1 < puVar3);
    }
    else {
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar1 = Y1[lVar5];
        uVar7 = uVar1 + uVar6 + mod[lVar5];
        uVar4 = (ulong)(uVar7 < uVar1);
        if (uVar7 == uVar1) {
          uVar4 = uVar6;
        }
        Y1[lVar5] = uVar7;
        lVar5 = lVar5 + 1;
        uVar6 = uVar4;
      } while (lVar5 != 4);
      puVar3 = Y1 + 4;
      uVar6 = 0;
      do {
        uVar1 = puVar3[-1];
        puVar3[-1] = uVar1 >> 1 | uVar6;
        puVar3 = puVar3 + -1;
        uVar6 = uVar1 << 0x3f;
      } while (Y1 < puVar3);
      Y1[3] = Y1[3] | uVar4 << 0x3f;
    }
    uECC_vli_mult(auStack_b8,Y1,Y1,curve->num_words);
    (*curve->mmod_fast)(X1,auStack_b8);
    uECC_vli_modSub(X1,X1,local_58,mod,'\x04');
    uECC_vli_modSub(X1,X1,local_58,mod,'\x04');
    uECC_vli_modSub(local_58,local_58,X1,mod,'\x04');
    uECC_vli_mult(auStack_b8,Y1,local_58,curve->num_words);
    (*curve->mmod_fast)(Y1,auStack_b8);
    uECC_vli_modSub(Y1,Y1,local_78,mod,'\x04');
  }
  return;
}

Assistant:

uECC_VLI_API uECC_word_t uECC_vli_isZero(const uECC_word_t *vli, wordcount_t num_words) {
    uECC_word_t bits = 0;
    wordcount_t i;
    for (i = 0; i < num_words; ++i) {
        bits |= vli[i];
    }
    return (bits == 0);
}